

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSMTree.cpp
# Opt level: O0

string * __thiscall
LSMTree::get_abi_cxx11_(string *__return_storage_ptr__,LSMTree *this,longlong key)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_61;
  undefined4 local_60;
  bool local_50;
  bool success;
  string *local_28;
  string *memory_result;
  longlong key_local;
  LSMTree *this_local;
  
  memory_result = (string *)key;
  key_local = (longlong)this;
  this_local = (LSMTree *)__return_storage_ptr__;
  iVar1 = (*(this->memory->
            super_Dictionary<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )._vptr_Dictionary[2])(this->memory,key);
  local_28 = (string *)CONCAT44(extraout_var,iVar1);
  if (local_28 == (string *)0x0) {
    DiskTable::get((QueryResult *)&stack0xffffffffffffffb0,this->disk,(longlong)memory_result);
    if ((local_50 & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_61);
      std::allocator<char>::~allocator(&local_61);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&success);
    }
    local_60 = 1;
    DiskTable::anon_struct_40_2_05104afe::~QueryResult
              ((anon_struct_40_2_05104afe *)&stack0xffffffffffffffb0);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LSMTree::get(long long key) {
    auto memory_result = memory->get(key);
    if (memory_result != nullptr) {
        return *memory_result;
    } else {
        auto[success, disk_result]=disk->get(key);
        if (success) {
            return disk_result;
        } else {
            return "";
        }
    }
}